

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

void __thiscall args::NamedBase::NamedBase(NamedBase *this,string *name_,string *help_)

{
  pointer pcVar1;
  
  (this->super_Base)._vptr_Base = (_func_int **)&PTR__Base_0013c770;
  (this->super_Base).matched = false;
  (this->super_Base).help._M_dataplus._M_p = (pointer)&(this->super_Base).help.field_2;
  pcVar1 = (help_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Base).help,pcVar1,pcVar1 + help_->_M_string_length);
  (this->super_Base)._vptr_Base = (_func_int **)&PTR__NamedBase_0013c8c8;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + name_->_M_string_length);
  this->kickout = false;
  return;
}

Assistant:

NamedBase(const std::string &name_, const std::string &help_) : Base(help_), name(name_), kickout(false) {}